

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentationFormatter.cxx
# Opt level: O0

void __thiscall
cmDocumentationFormatter::PrintSection
          (cmDocumentationFormatter *this,ostream *os,cmDocumentationSection *section)

{
  cmDocumentationSection *pcVar1;
  bool bVar2;
  _Setw _Var3;
  ostream *poVar4;
  vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> *this_00;
  reference pcVar5;
  ulong uVar6;
  size_t sVar7;
  char *pcVar8;
  int local_84;
  int i;
  int align;
  cmDocumentationEntry *entry;
  const_iterator __end1;
  const_iterator __begin1;
  vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> *__range1;
  vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> *entries;
  string local_40;
  cmDocumentationSection *local_20;
  cmDocumentationSection *section_local;
  ostream *os_local;
  cmDocumentationFormatter *this_local;
  
  local_20 = section;
  section_local = (cmDocumentationSection *)os;
  os_local = (ostream *)this;
  cmDocumentationSection::GetName_abi_cxx11_(&local_40,section);
  poVar4 = std::operator<<(os,(string *)&local_40);
  std::operator<<(poVar4,"\n");
  std::__cxx11::string::~string((string *)&local_40);
  this_00 = cmDocumentationSection::GetEntries(local_20);
  __end1 = std::vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>::begin(this_00);
  entry = (cmDocumentationEntry *)
          std::vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>::end(this_00);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_cmDocumentationEntry_*,_std::vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>_>
                                *)&entry);
    if (!bVar2) break;
    pcVar5 = __gnu_cxx::
             __normal_iterator<const_cmDocumentationEntry_*,_std::vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>_>
             ::operator*(&__end1);
    uVar6 = std::__cxx11::string::empty();
    pcVar1 = section_local;
    if ((uVar6 & 1) == 0) {
      _Var3 = std::setw(2);
      poVar4 = std::operator<<((ostream *)pcVar1,_Var3);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::left);
      poVar4 = std::operator<<(poVar4,pcVar5->CustomNamePrefix);
      std::operator<<(poVar4,(string *)pcVar5);
      this->TextIndent = "                                 ";
      sVar7 = strlen(this->TextIndent);
      for (local_84 = std::__cxx11::string::size(); local_84 < (int)sVar7 + -4;
          local_84 = local_84 + 1) {
        std::operator<<((ostream *)section_local," ");
      }
      uVar6 = std::__cxx11::string::size();
      sVar7 = strlen(this->TextIndent);
      if (sVar7 - 4 < uVar6) {
        std::operator<<((ostream *)section_local,"\n");
        pcVar1 = section_local;
        pcVar8 = this->TextIndent;
        strlen(this->TextIndent);
        std::ostream::write((char *)pcVar1,(long)pcVar8);
      }
      std::operator<<((ostream *)section_local,"= ");
      pcVar1 = section_local;
      pcVar8 = (char *)std::__cxx11::string::c_str();
      PrintColumn(this,(ostream *)pcVar1,pcVar8);
      std::operator<<((ostream *)section_local,"\n");
    }
    else {
      std::operator<<((ostream *)section_local,"\n");
      pcVar1 = section_local;
      this->TextIndent = "";
      pcVar8 = (char *)std::__cxx11::string::c_str();
      PrintFormatted(this,(ostream *)pcVar1,pcVar8);
    }
    __gnu_cxx::
    __normal_iterator<const_cmDocumentationEntry_*,_std::vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>_>
    ::operator++(&__end1);
  }
  std::operator<<((ostream *)section_local,"\n");
  return;
}

Assistant:

void cmDocumentationFormatter::PrintSection(
  std::ostream& os, cmDocumentationSection const& section)
{
  os << section.GetName() << "\n";

  const std::vector<cmDocumentationEntry>& entries = section.GetEntries();
  for (cmDocumentationEntry const& entry : entries) {
    if (!entry.Name.empty()) {
      os << std::setw(2) << std::left << entry.CustomNamePrefix << entry.Name;
      this->TextIndent = "                                 ";
      int align = static_cast<int>(strlen(this->TextIndent)) - 4;
      for (int i = static_cast<int>(entry.Name.size()); i < align; ++i) {
        os << " ";
      }
      if (entry.Name.size() > strlen(this->TextIndent) - 4) {
        os << "\n";
        os.write(this->TextIndent, strlen(this->TextIndent) - 2);
      }
      os << "= ";
      this->PrintColumn(os, entry.Brief.c_str());
      os << "\n";
    } else {
      os << "\n";
      this->TextIndent = "";
      this->PrintFormatted(os, entry.Brief.c_str());
    }
  }
  os << "\n";
}